

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xpath_node_set_raw::append
          (xpath_node_set_raw *this,xpath_node *begin_,xpath_node *end_,xpath_allocator *alloc)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  xpath_node *pxVar4;
  xpath_node *data;
  size_t count;
  size_t capacity;
  size_t size_;
  xpath_allocator *alloc_local;
  xpath_node *end__local;
  xpath_node *begin__local;
  xpath_node_set_raw *this_local;
  
  if (begin_ != end_) {
    lVar1 = (long)this->_end - (long)this->_begin >> 4;
    uVar2 = (long)this->_eos - (long)this->_begin >> 4;
    lVar3 = (long)end_ - (long)begin_ >> 4;
    if (uVar2 < (ulong)(lVar1 + lVar3)) {
      pxVar4 = (xpath_node *)
               xpath_allocator::reallocate(alloc,this->_begin,uVar2 << 4,(lVar1 + lVar3) * 0x10);
      if (pxVar4 == (xpath_node *)0x0) {
        return;
      }
      this->_begin = pxVar4;
      this->_end = pxVar4 + lVar1;
      this->_eos = pxVar4 + lVar1 + lVar3;
    }
    memcpy(this->_end,begin_,lVar3 << 4);
    this->_end = this->_end + lVar3;
  }
  return;
}

Assistant:

void append(const xpath_node* begin_, const xpath_node* end_, xpath_allocator* alloc)
		{
			if (begin_ == end_) return;

			size_t size_ = static_cast<size_t>(_end - _begin);
			size_t capacity = static_cast<size_t>(_eos - _begin);
			size_t count = static_cast<size_t>(end_ - begin_);

			if (size_ + count > capacity)
			{
				// reallocate the old array or allocate a new one
				xpath_node* data = static_cast<xpath_node*>(alloc->reallocate(_begin, capacity * sizeof(xpath_node), (size_ + count) * sizeof(xpath_node)));
				if (!data) return;

				// finalize
				_begin = data;
				_end = data + size_;
				_eos = data + size_ + count;
			}

			memcpy(_end, begin_, count * sizeof(xpath_node));
			_end += count;
		}